

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O0

void __thiscall
CTestResource_TestPlanar2D_YV12_Test::TestBody(CTestResource_TestPlanar2D_YV12_Test *this)

{
  uint32_t uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  char *pcVar5;
  AssertHelper local_1e0;
  Message local_1d8;
  unsigned_long local_1d0;
  uint local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_5;
  Message local_1a8;
  unsigned_long local_1a0;
  uint local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_4;
  uint32_t UByteOffset;
  Message local_170;
  unsigned_long local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  Message local_148;
  undefined8 local_140;
  undefined4 local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  Message local_118;
  undefined8 local_110;
  undefined4 local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8 [3];
  undefined8 local_d0;
  undefined4 local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  uint32_t Size;
  uint32_t Height;
  uint32_t SizeOfY;
  uint32_t Pitch;
  GMM_RESOURCE_INFO *ResourceInfo;
  GMM_RESCREATE_PARAMS gmmParams;
  CTestResource_TestPlanar2D_YV12_Test *this_local;
  
  gmmParams.MaximumRenamingListLength = 0;
  gmmParams.NoGfxMemory = '\0';
  gmmParams._109_3_ = 0;
  gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
  gmmParams.pExistingSysMem = 0;
  gmmParams.BaseAlignment = 0;
  gmmParams.OverridePitch = 0;
  gmmParams.RotateInfo = 0;
  gmmParams._84_4_ = 0;
  gmmParams.BaseHeight = 0;
  gmmParams.Depth = 0;
  gmmParams.MaxLod = 0;
  gmmParams.ArraySize = 0;
  gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
  gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
  gmmParams.MSAA.NumSamples = 0;
  gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
  gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
  gmmParams.ExistingSysMemSize = 0x100000000;
  gmmParams.Type = RESOURCE_INVALID;
  gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
  gmmParams.CpTag = 0x100;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth64 = 0x100000100;
  gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x80000;
  ResourceInfo = (GMM_RESOURCE_INFO *)0x17400000002;
  ResourceInfo_00 =
       (GMM_RESOURCE_INFO *)
       (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                 (CommonULT::pGmmULTClientContext,&ResourceInfo);
  uVar2 = gmmParams._40_8_;
  uVar1 = gmmParams.CpTag;
  uVar4 = gmmParams.CpTag * gmmParams.field_6.BaseWidth;
  gtest_ar.message_.ptr_._4_4_ = (uVar4 + (uVar4 >> 2) * 2) / gmmParams.CpTag;
  gtest_ar.message_.ptr_._0_4_ = gmmParams.CpTag * gtest_ar.message_.ptr_._4_4_ + 0xfff & 0xfffff000
  ;
  CTestResource::VerifyResourcePitch<true>
            (&this->super_CTestResource,ResourceInfo_00,gmmParams.CpTag);
  CTestResource::VerifyResourcePitchInTiles<false>(&this->super_CTestResource,ResourceInfo_00,0);
  CTestResource::VerifyResourceSize<true>
            (&this->super_CTestResource,ResourceInfo_00,(ulong)(uint)gtest_ar.message_.ptr_);
  CTestResource::VerifyResourceHAlign<false>(&this->super_CTestResource,ResourceInfo_00,0);
  CTestResource::VerifyResourceVAlign<false>(&this->super_CTestResource,ResourceInfo_00,0);
  CTestResource::VerifyResourceQPitch<false>(&this->super_CTestResource,ResourceInfo_00,0);
  local_c4 = 0;
  local_d0 = (**(code **)(*(long *)ResourceInfo_00 + 0x210))(ResourceInfo_00,1);
  testing::internal::EqHelper<true>::Compare<int,unsigned_long>
            ((char *)local_c0,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y)",
             (unsigned_long *)&local_c4,&local_d0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar3) {
    testing::Message::Message(local_e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
               ,0xd2f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_104 = 0;
  local_110 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,1);
  testing::internal::EqHelper<true>::Compare<int,unsigned_long>
            ((char *)local_100,"0",(int *)"ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y)",
             (unsigned_long *)&local_104,&local_110);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar3) {
    testing::Message::Message(&local_118);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
               ,0xd30,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_134 = 0;
  local_140 = (**(code **)(*(long *)ResourceInfo_00 + 0x210))(ResourceInfo_00,3);
  testing::internal::EqHelper<true>::Compare<int,unsigned_long>
            ((char *)local_130,"0",(int *)"ResourceInfo->GetPlanarXOffset(GMM_PLANE_V)",
             (unsigned_long *)&local_134,&local_140);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar3) {
    testing::Message::Message(&local_148);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
               ,0xd33,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_168 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))(ResourceInfo_00,3);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_160,"gmmParams.BaseHeight",
             "ResourceInfo->GetPlanarYOffset(GMM_PLANE_V)",&gmmParams.field_6.BaseWidth,&local_168);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar3) {
    testing::Message::Message(&local_170);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
               ,0xd34,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe88,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe88);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  gtest_ar_4.message_.ptr_._4_4_ = uVar4 + (uVar4 >> 2);
  local_194 = (uint)((ulong)gtest_ar_4.message_.ptr_._4_4_ % (uVar2 & 0xffffffff));
  local_1a0 = (**(code **)(*(long *)ResourceInfo_00 + 0x210))(ResourceInfo_00,2);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_190,"UByteOffset % Pitch",
             "ResourceInfo->GetPlanarXOffset(GMM_PLANE_U)",&local_194,&local_1a0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar3) {
    testing::Message::Message(&local_1a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
               ,0xd39,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1c4 = gtest_ar_4.message_.ptr_._4_4_ / uVar1;
  local_1d0 = (**(code **)(*(long *)ResourceInfo_00 + 0x218))
                        (ResourceInfo_00,2,
                         (ulong)gtest_ar_4.message_.ptr_._4_4_ % (uVar2 & 0xffffffff));
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_1c0,"UByteOffset / Pitch",
             "ResourceInfo->GetPlanarYOffset(GMM_PLANE_U)",&local_1c4,&local_1d0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar3) {
    testing::Message::Message(&local_1d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmResourceULT.cpp"
               ,0xd3a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
            (CommonULT::pGmmULTClientContext,ResourceInfo_00);
  return;
}

Assistant:

TEST_F(CTestResource, TestPlanar2D_YV12)
{
    /* Test planar surface V surface follows U surface linearly */
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // YYYYYYYY
    // VVVVVV..  <-- V and U planes follow the Y plane, as linear
    // ..UUUUUU      arrays--without respect to pitch.
    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.BaseWidth64          = 0x100;
    gmmParams.BaseHeight           = 0x100;
    gmmParams.Depth                = 0x1;
    gmmParams.Flags.Info.Linear    = 1; // Linear only since UV plane doesn't have a pitch
    gmmParams.Format               = GMM_FORMAT_YV12;

    GMM_RESOURCE_INFO *ResourceInfo;
    ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

    uint32_t Pitch   = gmmParams.BaseWidth64;
    uint32_t SizeOfY = Pitch * gmmParams.BaseHeight;
    uint32_t Height  = (SizeOfY /*Y*/ + SizeOfY / 4 /*V*/ + SizeOfY / 4 /*U*/) / Pitch;
    uint32_t Size    = GMM_ULT_ALIGN(Pitch * Height, GMM_KBYTE(4));

    VerifyResourcePitch<true>(ResourceInfo, Pitch);
    VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
    VerifyResourceSize<true>(ResourceInfo, Size);
    VerifyResourceHAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceVAlign<false>(ResourceInfo, 0); // Same as any other 2D surface -- tested elsewhere
    VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for planar

    // Y plane should be at 0,0
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_Y));
    EXPECT_EQ(0, ResourceInfo->GetPlanarYOffset(GMM_PLANE_Y));

    // V plane follows Y
    EXPECT_EQ(0, ResourceInfo->GetPlanarXOffset(GMM_PLANE_V));
    EXPECT_EQ(gmmParams.BaseHeight, ResourceInfo->GetPlanarYOffset(GMM_PLANE_V));

    // U plane should be at end of V plane
    uint32_t UByteOffset = SizeOfY /* Y */ +
                           SizeOfY / 4; /* Size of V = 1/4 of Y */
    EXPECT_EQ(UByteOffset % Pitch, ResourceInfo->GetPlanarXOffset(GMM_PLANE_U));
    EXPECT_EQ(UByteOffset / Pitch, ResourceInfo->GetPlanarYOffset(GMM_PLANE_U));

    pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
}